

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O1

int md_is_container_mark
              (MD_CTX *ctx,uint indent,MD_OFFSET beg,MD_OFFSET *p_end,MD_CONTAINER *p_container)

{
  char cVar1;
  MD_CHAR *pMVar2;
  MD_OFFSET MVar3;
  void *pvVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = ctx->size;
  if (uVar6 <= beg) {
    return 0;
  }
  if (ctx->code_indent_offset <= indent) {
    return 0;
  }
  pMVar2 = ctx->text;
  cVar1 = pMVar2[beg];
  if (cVar1 != '\0') {
    if (cVar1 == '>') {
      uVar7 = beg + 1;
      p_container->ch = '>';
      *(undefined2 *)&p_container->field_0x1 = 0;
      p_container->mark_indent = indent;
      uVar6 = indent + 1;
      goto LAB_005d5c3b;
    }
    pvVar4 = memchr("-+*",(int)cVar1,4);
    if ((pvVar4 != (void *)0x0) &&
       ((uVar7 = beg + 1, uVar6 <= uVar7 ||
        (((ulong)(byte)pMVar2[uVar7] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)pMVar2[uVar7] & 0x3f) & 1) != 0)))))) {
      p_container->ch = cVar1;
      *(undefined2 *)&p_container->field_0x1 = 0;
      p_container->mark_indent = indent;
      uVar6 = indent + 1;
      goto LAB_005d5c3b;
    }
  }
  uVar7 = beg + 9;
  if (uVar6 <= beg + 9) {
    uVar7 = uVar6;
  }
  p_container->start = 0;
  MVar3 = beg;
  if (beg < uVar7) {
    pbVar5 = (byte *)(pMVar2 + beg);
    do {
      if (9 < (byte)(*pbVar5 - 0x30)) break;
      p_container->start = ((uint)*pbVar5 + p_container->start * 10) - 0x30;
      MVar3 = MVar3 + 1;
      pbVar5 = pbVar5 + 1;
    } while (uVar7 != MVar3);
  }
  if (uVar6 <= MVar3 || MVar3 <= beg) {
    return 0;
  }
  cVar1 = pMVar2[MVar3];
  if ((cVar1 != '.') && (cVar1 != ')')) {
    return 0;
  }
  uVar7 = MVar3 + 1;
  if (uVar7 < uVar6) {
    if (0x20 < (ulong)(byte)pMVar2[uVar7]) {
      return 0;
    }
    if ((0x100002600U >> ((ulong)(byte)pMVar2[uVar7] & 0x3f) & 1) == 0) {
      return 0;
    }
  }
  p_container->ch = cVar1;
  *(undefined2 *)&p_container->field_0x1 = 0;
  p_container->mark_indent = indent;
  uVar6 = (indent - beg) + MVar3 + 1;
LAB_005d5c3b:
  p_container->contents_indent = uVar6;
  *p_end = uVar7;
  return 1;
}

Assistant:

static int
md_is_container_mark(MD_CTX* ctx, unsigned indent, OFF beg, OFF* p_end, MD_CONTAINER* p_container)
{
    OFF off = beg;
    OFF max_end;

    if(off >= ctx->size  ||  indent >= ctx->code_indent_offset)
        return FALSE;

    /* Check for block quote mark. */
    if(CH(off) == _T('>')) {
        off++;
        p_container->ch = _T('>');
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off;
        return TRUE;
    }

    /* Check for list item bullet mark. */
    if(ISANYOF(off, _T("-+*"))  &&  (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1))) {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off+1;
        return TRUE;
    }

    /* Check for ordered list item marks. */
    max_end = off + 9;
    if(max_end > ctx->size)
        max_end = ctx->size;
    p_container->start = 0;
    while(off < max_end  &&  ISDIGIT(off)) {
        p_container->start = p_container->start * 10 + CH(off) - _T('0');
        off++;
    }
    if(off > beg  &&
       off < ctx->size  &&
       (CH(off) == _T('.') || CH(off) == _T(')'))  &&
       (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1)))
    {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + off - beg + 1;
        *p_end = off+1;
        return TRUE;
    }

    return FALSE;
}